

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

_Bool Curl_creader_is_paused(Curl_easy *data)

{
  Curl_creader *pCVar1;
  _Bool _Var2;
  Curl_creader **ppCVar3;
  
  ppCVar3 = &(data->req).reader_stack;
  do {
    pCVar1 = *ppCVar3;
    if (pCVar1 == (Curl_creader *)0x0) break;
    _Var2 = (*pCVar1->crt->is_paused)(data,pCVar1);
    ppCVar3 = &pCVar1->next;
  } while (!_Var2);
  return pCVar1 != (Curl_creader *)0x0;
}

Assistant:

bool Curl_creader_is_paused(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;

  while(reader) {
    if(reader->crt->is_paused(data, reader))
      return TRUE;
    reader = reader->next;
  }
  return FALSE;
}